

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cxx
# Opt level: O0

DisplayAction * setLineStyle(DisplayAction *__return_storage_ptr__,int style)

{
  offset_in_Display_to_subr in_R9;
  allocator<char> local_39;
  string local_38;
  int local_14;
  DisplayAction *pDStack_10;
  int style_local;
  
  local_14 = style;
  pDStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  DisplayAction::DisplayAction(__return_storage_ptr__,style,&local_38,0,0,in_R9);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

DisplayAction setLineStyle( const int style )
{
	return DisplayAction(style, "", 0, &Display::setLineStyle, 0);
}